

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O1

uint __thiscall llvm::dwarf::getLanguage(dwarf *this,StringRef LanguageString)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  char cVar4;
  char cVar5;
  uint uVar6;
  char *pcVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  
  pcVar7 = LanguageString.Data;
  uVar2 = 0;
  if (pcVar7 == (char *)0xb) {
    uVar2 = (uint)(*(long *)(this + 3) == 0x3938435f474e414c && *(long *)this == 0x5f474e414c5f5744)
    ;
  }
  uVar3 = uVar2;
  uVar6 = uVar2;
  if ((pcVar7 == &DAT_00000009) && ((char)uVar2 == '\0')) {
    if (this[8] == (dwarf)0x43 && *(long *)this == 0x5f474e414c5f5744) {
      uVar3 = 2;
    }
    uVar6 = 1;
    if (this[8] != (dwarf)0x43 || *(long *)this != 0x5f474e414c5f5744) {
      uVar6 = uVar2;
    }
  }
  cVar5 = (char)uVar6;
  cVar4 = cVar5;
  if ((pcVar7 == (char *)0xd) && (cVar5 == '\0')) {
    if (*(long *)(this + 5) == 0x33386164415f474e && *(long *)this == 0x5f474e414c5f5744) {
      uVar3 = 3;
    }
    cVar4 = '\x01';
    if (*(long *)(this + 5) != 0x33386164415f474e || *(long *)this != 0x5f474e414c5f5744) {
      cVar4 = cVar5;
    }
  }
  cVar5 = cVar4;
  if ((pcVar7 == (char *)0x13) && (cVar4 == '\0')) {
    auVar24[0] = -(*this == (dwarf)0x44);
    auVar24[1] = -(this[1] == (dwarf)0x57);
    auVar24[2] = -(this[2] == (dwarf)0x5f);
    auVar24[3] = -(this[3] == (dwarf)0x4c);
    auVar24[4] = -(this[4] == (dwarf)0x41);
    auVar24[5] = -(this[5] == (dwarf)0x4e);
    auVar24[6] = -(this[6] == (dwarf)0x47);
    auVar24[7] = -(this[7] == (dwarf)0x5f);
    auVar24[8] = -(this[8] == (dwarf)0x43);
    auVar24[9] = -(this[9] == (dwarf)0x5f);
    auVar24[10] = -(this[10] == (dwarf)0x70);
    auVar24[0xb] = -(this[0xb] == (dwarf)0x6c);
    auVar24[0xc] = -(this[0xc] == (dwarf)0x75);
    auVar24[0xd] = -(this[0xd] == (dwarf)0x73);
    auVar24[0xe] = -(this[0xe] == (dwarf)0x5f);
    auVar24[0xf] = -(this[0xf] == (dwarf)0x70);
    auVar9[0] = -(this[3] == (dwarf)'L');
    auVar9[1] = -(this[4] == (dwarf)'A');
    auVar9[2] = -(this[5] == (dwarf)'N');
    auVar9[3] = -(this[6] == (dwarf)'G');
    auVar9[4] = -(this[7] == (dwarf)'_');
    auVar9[5] = -(this[8] == (dwarf)'C');
    auVar9[6] = -(this[9] == (dwarf)'_');
    auVar9[7] = -(this[10] == (dwarf)'p');
    auVar9[8] = -(this[0xb] == (dwarf)'l');
    auVar9[9] = -(this[0xc] == (dwarf)'u');
    auVar9[10] = -(this[0xd] == (dwarf)'s');
    auVar9[0xb] = -(this[0xe] == (dwarf)'_');
    auVar9[0xc] = -(this[0xf] == (dwarf)'p');
    auVar9[0xd] = -(this[0x10] == (dwarf)'l');
    auVar9[0xe] = -(this[0x11] == (dwarf)'u');
    auVar9[0xf] = -(this[0x12] == (dwarf)'s');
    auVar9 = auVar9 & auVar24;
    bVar8 = (ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar8) {
      uVar3 = 4;
    }
    cVar5 = '\x01';
    if (!bVar8) {
      cVar5 = cVar4;
    }
  }
  cVar4 = cVar5;
  if ((pcVar7 == (char *)0xf) && (cVar5 == '\0')) {
    if (*(long *)(this + 7) == 0x34376c6f626f435f && *(long *)this == 0x5f474e414c5f5744) {
      uVar3 = 5;
    }
    cVar4 = '\x01';
    if (*(long *)(this + 7) != 0x34376c6f626f435f || *(long *)this != 0x5f474e414c5f5744) {
      cVar4 = cVar5;
    }
  }
  cVar5 = cVar4;
  if ((pcVar7 == (char *)0xf) && (cVar4 == '\0')) {
    if (*(long *)(this + 7) == 0x35386c6f626f435f && *(long *)this == 0x5f474e414c5f5744) {
      uVar3 = 6;
    }
    cVar5 = '\x01';
    if (*(long *)(this + 7) != 0x35386c6f626f435f || *(long *)this != 0x5f474e414c5f5744) {
      cVar5 = cVar4;
    }
  }
  cVar4 = cVar5;
  if ((pcVar7 == (char *)0x11) && (cVar5 == '\0')) {
    auVar10[0] = -(*this == (dwarf)'D');
    auVar10[1] = -(this[1] == (dwarf)'W');
    auVar10[2] = -(this[2] == (dwarf)'_');
    auVar10[3] = -(this[3] == (dwarf)'L');
    auVar10[4] = -(this[4] == (dwarf)'A');
    auVar10[5] = -(this[5] == (dwarf)'N');
    auVar10[6] = -(this[6] == (dwarf)'G');
    auVar10[7] = -(this[7] == (dwarf)'_');
    auVar10[8] = -(this[8] == (dwarf)'F');
    auVar10[9] = -(this[9] == (dwarf)'o');
    auVar10[10] = -(this[10] == (dwarf)'r');
    auVar10[0xb] = -(this[0xb] == (dwarf)'t');
    auVar10[0xc] = -(this[0xc] == (dwarf)'r');
    auVar10[0xd] = -(this[0xd] == (dwarf)'a');
    auVar10[0xe] = -(this[0xe] == (dwarf)'n');
    auVar10[0xf] = -(this[0xf] == (dwarf)'7');
    auVar25[0] = -(this[0x10] == (dwarf)'7');
    auVar25[1] = 0xff;
    auVar25[2] = 0xff;
    auVar25[3] = 0xff;
    auVar25[4] = 0xff;
    auVar25[5] = 0xff;
    auVar25[6] = 0xff;
    auVar25[7] = 0xff;
    auVar25[8] = 0xff;
    auVar25[9] = 0xff;
    auVar25[10] = 0xff;
    auVar25[0xb] = 0xff;
    auVar25[0xc] = 0xff;
    auVar25[0xd] = 0xff;
    auVar25[0xe] = 0xff;
    auVar25[0xf] = 0xff;
    auVar25 = auVar25 & auVar10;
    bVar8 = (ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar8) {
      uVar3 = 7;
    }
    cVar4 = '\x01';
    if (!bVar8) {
      cVar4 = cVar5;
    }
  }
  cVar5 = cVar4;
  if ((pcVar7 == (char *)0x11) && (cVar4 == '\0')) {
    auVar26[0] = -(*this == (dwarf)0x44);
    auVar26[1] = -(this[1] == (dwarf)0x57);
    auVar26[2] = -(this[2] == (dwarf)0x5f);
    auVar26[3] = -(this[3] == (dwarf)0x4c);
    auVar26[4] = -(this[4] == (dwarf)0x41);
    auVar26[5] = -(this[5] == (dwarf)0x4e);
    auVar26[6] = -(this[6] == (dwarf)0x47);
    auVar26[7] = -(this[7] == (dwarf)0x5f);
    auVar26[8] = -(this[8] == (dwarf)0x46);
    auVar26[9] = -(this[9] == (dwarf)0x6f);
    auVar26[10] = -(this[10] == (dwarf)0x72);
    auVar26[0xb] = -(this[0xb] == (dwarf)0x74);
    auVar26[0xc] = -(this[0xc] == (dwarf)0x72);
    auVar26[0xd] = -(this[0xd] == (dwarf)0x61);
    auVar26[0xe] = -(this[0xe] == (dwarf)0x6e);
    auVar26[0xf] = -(this[0xf] == (dwarf)0x39);
    auVar11[0] = -(this[0x10] == (dwarf)0x30);
    auVar11[1] = 0xff;
    auVar11[2] = 0xff;
    auVar11[3] = 0xff;
    auVar11[4] = 0xff;
    auVar11[5] = 0xff;
    auVar11[6] = 0xff;
    auVar11[7] = 0xff;
    auVar11[8] = 0xff;
    auVar11[9] = 0xff;
    auVar11[10] = 0xff;
    auVar11[0xb] = 0xff;
    auVar11[0xc] = 0xff;
    auVar11[0xd] = 0xff;
    auVar11[0xe] = 0xff;
    auVar11[0xf] = 0xff;
    auVar11 = auVar11 & auVar26;
    bVar8 = (ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar8) {
      uVar3 = 8;
    }
    cVar5 = '\x01';
    if (!bVar8) {
      cVar5 = cVar4;
    }
  }
  cVar4 = cVar5;
  if ((pcVar7 == (char *)0x10) && (cVar5 == '\0')) {
    auVar12[0] = -(*this == (dwarf)'D');
    auVar12[1] = -(this[1] == (dwarf)'W');
    auVar12[2] = -(this[2] == (dwarf)'_');
    auVar12[3] = -(this[3] == (dwarf)'L');
    auVar12[4] = -(this[4] == (dwarf)'A');
    auVar12[5] = -(this[5] == (dwarf)'N');
    auVar12[6] = -(this[6] == (dwarf)'G');
    auVar12[7] = -(this[7] == (dwarf)'_');
    auVar12[8] = -(this[8] == (dwarf)'P');
    auVar12[9] = -(this[9] == (dwarf)'a');
    auVar12[10] = -(this[10] == (dwarf)'s');
    auVar12[0xb] = -(this[0xb] == (dwarf)'c');
    auVar12[0xc] = -(this[0xc] == (dwarf)'a');
    auVar12[0xd] = -(this[0xd] == (dwarf)'l');
    auVar12[0xe] = -(this[0xe] == (dwarf)'8');
    auVar12[0xf] = -(this[0xf] == (dwarf)'3');
    bVar8 = (ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar12[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar8) {
      uVar3 = 9;
    }
    cVar4 = '\x01';
    if (!bVar8) {
      cVar4 = cVar5;
    }
  }
  cVar5 = cVar4;
  if ((pcVar7 == (char *)0xf) && (cVar4 == '\0')) {
    if (*(long *)(this + 7) == 0x32616c75646f4d5f && *(long *)this == 0x5f474e414c5f5744) {
      uVar3 = 10;
    }
    cVar5 = '\x01';
    if (*(long *)(this + 7) != 0x32616c75646f4d5f || *(long *)this != 0x5f474e414c5f5744) {
      cVar5 = cVar4;
    }
  }
  cVar4 = cVar5;
  if ((pcVar7 == (char *)0xc) && (cVar5 == '\0')) {
    if (*(int *)(this + 8) == 0x6176614a && *(long *)this == 0x5f474e414c5f5744) {
      uVar3 = 0xb;
    }
    cVar4 = '\x01';
    if (*(int *)(this + 8) != 0x6176614a || *(long *)this != 0x5f474e414c5f5744) {
      cVar4 = cVar5;
    }
  }
  cVar5 = cVar4;
  if ((pcVar7 == (char *)0xb) && (cVar4 == '\0')) {
    if (*(long *)(this + 3) == 0x3939435f474e414c && *(long *)this == 0x5f474e414c5f5744) {
      uVar3 = 0xc;
    }
    cVar5 = '\x01';
    if (*(long *)(this + 3) != 0x3939435f474e414c || *(long *)this != 0x5f474e414c5f5744) {
      cVar5 = cVar4;
    }
  }
  cVar4 = cVar5;
  if ((pcVar7 == (char *)0xd) && (cVar5 == '\0')) {
    if (*(long *)(this + 5) == 0x35396164415f474e && *(long *)this == 0x5f474e414c5f5744) {
      uVar3 = 0xd;
    }
    cVar4 = '\x01';
    if (*(long *)(this + 5) != 0x35396164415f474e || *(long *)this != 0x5f474e414c5f5744) {
      cVar4 = cVar5;
    }
  }
  cVar5 = cVar4;
  if ((pcVar7 == (char *)0x11) && (cVar4 == '\0')) {
    auVar27[0] = -(*this == (dwarf)0x44);
    auVar27[1] = -(this[1] == (dwarf)0x57);
    auVar27[2] = -(this[2] == (dwarf)0x5f);
    auVar27[3] = -(this[3] == (dwarf)0x4c);
    auVar27[4] = -(this[4] == (dwarf)0x41);
    auVar27[5] = -(this[5] == (dwarf)0x4e);
    auVar27[6] = -(this[6] == (dwarf)0x47);
    auVar27[7] = -(this[7] == (dwarf)0x5f);
    auVar27[8] = -(this[8] == (dwarf)0x46);
    auVar27[9] = -(this[9] == (dwarf)0x6f);
    auVar27[10] = -(this[10] == (dwarf)0x72);
    auVar27[0xb] = -(this[0xb] == (dwarf)0x74);
    auVar27[0xc] = -(this[0xc] == (dwarf)0x72);
    auVar27[0xd] = -(this[0xd] == (dwarf)0x61);
    auVar27[0xe] = -(this[0xe] == (dwarf)0x6e);
    auVar27[0xf] = -(this[0xf] == (dwarf)0x39);
    auVar13[0] = -(this[0x10] == (dwarf)'5');
    auVar13[1] = 0xff;
    auVar13[2] = 0xff;
    auVar13[3] = 0xff;
    auVar13[4] = 0xff;
    auVar13[5] = 0xff;
    auVar13[6] = 0xff;
    auVar13[7] = 0xff;
    auVar13[8] = 0xff;
    auVar13[9] = 0xff;
    auVar13[10] = 0xff;
    auVar13[0xb] = 0xff;
    auVar13[0xc] = 0xff;
    auVar13[0xd] = 0xff;
    auVar13[0xe] = 0xff;
    auVar13[0xf] = 0xff;
    auVar13 = auVar13 & auVar27;
    bVar8 = (ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar8) {
      uVar3 = 0xe;
    }
    cVar5 = '\x01';
    if (!bVar8) {
      cVar5 = cVar4;
    }
  }
  cVar4 = cVar5;
  if ((pcVar7 == (char *)0xb) && (cVar5 == '\0')) {
    if (*(long *)(this + 3) == 0x494c505f474e414c && *(long *)this == 0x5f474e414c5f5744) {
      uVar3 = 0xf;
    }
    cVar4 = '\x01';
    if (*(long *)(this + 3) != 0x494c505f474e414c || *(long *)this != 0x5f474e414c5f5744) {
      cVar4 = cVar5;
    }
  }
  cVar5 = cVar4;
  if ((pcVar7 == (char *)0xc) && (cVar4 == '\0')) {
    if (*(int *)(this + 8) == 0x436a624f && *(long *)this == 0x5f474e414c5f5744) {
      uVar3 = 0x10;
    }
    cVar5 = '\x01';
    if (*(int *)(this + 8) != 0x436a624f || *(long *)this != 0x5f474e414c5f5744) {
      cVar5 = cVar4;
    }
  }
  cVar4 = cVar5;
  if ((pcVar7 == (char *)0x16) && (cVar5 == '\0')) {
    auVar28[0] = -(this[6] == (dwarf)'G');
    auVar28[1] = -(this[7] == (dwarf)'_');
    auVar28[2] = -(this[8] == (dwarf)'O');
    auVar28[3] = -(this[9] == (dwarf)'b');
    auVar28[4] = -(this[10] == (dwarf)'j');
    auVar28[5] = -(this[0xb] == (dwarf)'C');
    auVar28[6] = -(this[0xc] == (dwarf)'_');
    auVar28[7] = -(this[0xd] == (dwarf)'p');
    auVar28[8] = -(this[0xe] == (dwarf)'l');
    auVar28[9] = -(this[0xf] == (dwarf)'u');
    auVar28[10] = -(this[0x10] == (dwarf)'s');
    auVar28[0xb] = -(this[0x11] == (dwarf)'_');
    auVar28[0xc] = -(this[0x12] == (dwarf)'p');
    auVar28[0xd] = -(this[0x13] == (dwarf)'l');
    auVar28[0xe] = -(this[0x14] == (dwarf)'u');
    auVar28[0xf] = -(this[0x15] == (dwarf)'s');
    auVar14[0] = -(*this == (dwarf)'D');
    auVar14[1] = -(this[1] == (dwarf)'W');
    auVar14[2] = -(this[2] == (dwarf)'_');
    auVar14[3] = -(this[3] == (dwarf)'L');
    auVar14[4] = -(this[4] == (dwarf)'A');
    auVar14[5] = -(this[5] == (dwarf)'N');
    auVar14[6] = -(this[6] == (dwarf)'G');
    auVar14[7] = -(this[7] == (dwarf)'_');
    auVar14[8] = -(this[8] == (dwarf)'O');
    auVar14[9] = -(this[9] == (dwarf)'b');
    auVar14[10] = -(this[10] == (dwarf)'j');
    auVar14[0xb] = -(this[0xb] == (dwarf)'C');
    auVar14[0xc] = -(this[0xc] == (dwarf)'_');
    auVar14[0xd] = -(this[0xd] == (dwarf)'p');
    auVar14[0xe] = -(this[0xe] == (dwarf)'l');
    auVar14[0xf] = -(this[0xf] == (dwarf)'u');
    auVar14 = auVar14 & auVar28;
    bVar8 = (ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar8) {
      uVar3 = 0x11;
    }
    cVar4 = '\x01';
    if (!bVar8) {
      cVar4 = cVar5;
    }
  }
  cVar5 = cVar4;
  if ((pcVar7 == (char *)0xb) && (cVar4 == '\0')) {
    if (*(long *)(this + 3) == 0x4350555f474e414c && *(long *)this == 0x5f474e414c5f5744) {
      uVar3 = 0x12;
    }
    cVar5 = '\x01';
    if (*(long *)(this + 3) != 0x4350555f474e414c || *(long *)this != 0x5f474e414c5f5744) {
      cVar5 = cVar4;
    }
  }
  cVar4 = cVar5;
  if ((pcVar7 == &DAT_00000009) && (cVar5 == '\0')) {
    if (this[8] == (dwarf)0x44 && *(long *)this == 0x5f474e414c5f5744) {
      uVar3 = 0x13;
    }
    cVar4 = '\x01';
    if (this[8] != (dwarf)0x44 || *(long *)this != 0x5f474e414c5f5744) {
      cVar4 = cVar5;
    }
  }
  cVar5 = cVar4;
  if ((pcVar7 == (char *)0xe) && (cVar4 == '\0')) {
    if (*(long *)(this + 6) == 0x6e6f687479505f47 && *(long *)this == 0x5f474e414c5f5744) {
      uVar3 = 0x14;
    }
    cVar5 = '\x01';
    if (*(long *)(this + 6) != 0x6e6f687479505f47 || *(long *)this != 0x5f474e414c5f5744) {
      cVar5 = cVar4;
    }
  }
  cVar4 = cVar5;
  if ((pcVar7 == (char *)0xe) && (cVar5 == '\0')) {
    if (*(long *)(this + 6) == 0x4c436e65704f5f47 && *(long *)this == 0x5f474e414c5f5744) {
      uVar3 = 0x15;
    }
    cVar4 = '\x01';
    if (*(long *)(this + 6) != 0x4c436e65704f5f47 || *(long *)this != 0x5f474e414c5f5744) {
      cVar4 = cVar5;
    }
  }
  cVar5 = cVar4;
  if ((pcVar7 == (char *)0xa) && (cVar4 == '\0')) {
    if (*(short *)(this + 8) == 0x6f47 && *(long *)this == 0x5f474e414c5f5744) {
      uVar3 = 0x16;
    }
    cVar5 = '\x01';
    if (*(short *)(this + 8) != 0x6f47 || *(long *)this != 0x5f474e414c5f5744) {
      cVar5 = cVar4;
    }
  }
  cVar4 = cVar5;
  if ((pcVar7 == (char *)0xf) && (cVar5 == '\0')) {
    if (*(long *)(this + 7) == 0x33616c75646f4d5f && *(long *)this == 0x5f474e414c5f5744) {
      uVar3 = 0x17;
    }
    cVar4 = '\x01';
    if (*(long *)(this + 7) != 0x33616c75646f4d5f || *(long *)this != 0x5f474e414c5f5744) {
      cVar4 = cVar5;
    }
  }
  cVar5 = cVar4;
  if ((pcVar7 == (char *)0xf) && (cVar4 == '\0')) {
    if (*(long *)(this + 7) == 0x6c6c656b7361485f && *(long *)this == 0x5f474e414c5f5744) {
      uVar3 = 0x18;
    }
    cVar5 = '\x01';
    if (*(long *)(this + 7) != 0x6c6c656b7361485f || *(long *)this != 0x5f474e414c5f5744) {
      cVar5 = cVar4;
    }
  }
  cVar4 = cVar5;
  if ((pcVar7 == (char *)0x16) && (cVar5 == '\0')) {
    auVar29[0] = -(*this == (dwarf)0x44);
    auVar29[1] = -(this[1] == (dwarf)0x57);
    auVar29[2] = -(this[2] == (dwarf)0x5f);
    auVar29[3] = -(this[3] == (dwarf)0x4c);
    auVar29[4] = -(this[4] == (dwarf)0x41);
    auVar29[5] = -(this[5] == (dwarf)0x4e);
    auVar29[6] = -(this[6] == (dwarf)0x47);
    auVar29[7] = -(this[7] == (dwarf)0x5f);
    auVar29[8] = -(this[8] == (dwarf)0x43);
    auVar29[9] = -(this[9] == (dwarf)0x5f);
    auVar29[10] = -(this[10] == (dwarf)0x70);
    auVar29[0xb] = -(this[0xb] == (dwarf)0x6c);
    auVar29[0xc] = -(this[0xc] == (dwarf)0x75);
    auVar29[0xd] = -(this[0xd] == (dwarf)0x73);
    auVar29[0xe] = -(this[0xe] == (dwarf)0x5f);
    auVar29[0xf] = -(this[0xf] == (dwarf)0x70);
    auVar15[0] = -(this[6] == (dwarf)'G');
    auVar15[1] = -(this[7] == (dwarf)'_');
    auVar15[2] = -(this[8] == (dwarf)'C');
    auVar15[3] = -(this[9] == (dwarf)'_');
    auVar15[4] = -(this[10] == (dwarf)'p');
    auVar15[5] = -(this[0xb] == (dwarf)'l');
    auVar15[6] = -(this[0xc] == (dwarf)'u');
    auVar15[7] = -(this[0xd] == (dwarf)'s');
    auVar15[8] = -(this[0xe] == (dwarf)'_');
    auVar15[9] = -(this[0xf] == (dwarf)'p');
    auVar15[10] = -(this[0x10] == (dwarf)'l');
    auVar15[0xb] = -(this[0x11] == (dwarf)'u');
    auVar15[0xc] = -(this[0x12] == (dwarf)'s');
    auVar15[0xd] = -(this[0x13] == (dwarf)'_');
    auVar15[0xe] = -(this[0x14] == (dwarf)'0');
    auVar15[0xf] = -(this[0x15] == (dwarf)'3');
    auVar15 = auVar15 & auVar29;
    bVar8 = (ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar8) {
      uVar3 = 0x19;
    }
    cVar4 = '\x01';
    if (!bVar8) {
      cVar4 = cVar5;
    }
  }
  cVar5 = cVar4;
  if ((pcVar7 == (char *)0x16) && (cVar4 == '\0')) {
    auVar30[0] = -(*this == (dwarf)0x44);
    auVar30[1] = -(this[1] == (dwarf)0x57);
    auVar30[2] = -(this[2] == (dwarf)0x5f);
    auVar30[3] = -(this[3] == (dwarf)0x4c);
    auVar30[4] = -(this[4] == (dwarf)0x41);
    auVar30[5] = -(this[5] == (dwarf)0x4e);
    auVar30[6] = -(this[6] == (dwarf)0x47);
    auVar30[7] = -(this[7] == (dwarf)0x5f);
    auVar30[8] = -(this[8] == (dwarf)0x43);
    auVar30[9] = -(this[9] == (dwarf)0x5f);
    auVar30[10] = -(this[10] == (dwarf)0x70);
    auVar30[0xb] = -(this[0xb] == (dwarf)0x6c);
    auVar30[0xc] = -(this[0xc] == (dwarf)0x75);
    auVar30[0xd] = -(this[0xd] == (dwarf)0x73);
    auVar30[0xe] = -(this[0xe] == (dwarf)0x5f);
    auVar30[0xf] = -(this[0xf] == (dwarf)0x70);
    auVar16[0] = -(this[6] == (dwarf)'G');
    auVar16[1] = -(this[7] == (dwarf)'_');
    auVar16[2] = -(this[8] == (dwarf)'C');
    auVar16[3] = -(this[9] == (dwarf)'_');
    auVar16[4] = -(this[10] == (dwarf)'p');
    auVar16[5] = -(this[0xb] == (dwarf)'l');
    auVar16[6] = -(this[0xc] == (dwarf)'u');
    auVar16[7] = -(this[0xd] == (dwarf)'s');
    auVar16[8] = -(this[0xe] == (dwarf)'_');
    auVar16[9] = -(this[0xf] == (dwarf)'p');
    auVar16[10] = -(this[0x10] == (dwarf)'l');
    auVar16[0xb] = -(this[0x11] == (dwarf)'u');
    auVar16[0xc] = -(this[0x12] == (dwarf)'s');
    auVar16[0xd] = -(this[0x13] == (dwarf)'_');
    auVar16[0xe] = -(this[0x14] == (dwarf)'1');
    auVar16[0xf] = -(this[0x15] == (dwarf)'1');
    auVar16 = auVar16 & auVar30;
    bVar8 = (ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar8) {
      uVar3 = 0x1a;
    }
    cVar5 = '\x01';
    if (!bVar8) {
      cVar5 = cVar4;
    }
  }
  cVar4 = cVar5;
  if ((pcVar7 == (char *)0xd) && (cVar5 == '\0')) {
    if (*(long *)(this + 5) == 0x6c6d61434f5f474e && *(long *)this == 0x5f474e414c5f5744) {
      uVar3 = 0x1b;
    }
    cVar4 = '\x01';
    if (*(long *)(this + 5) != 0x6c6d61434f5f474e || *(long *)this != 0x5f474e414c5f5744) {
      cVar4 = cVar5;
    }
  }
  cVar5 = cVar4;
  if ((pcVar7 == (char *)0xc) && (cVar4 == '\0')) {
    if (*(int *)(this + 8) == 0x74737552 && *(long *)this == 0x5f474e414c5f5744) {
      uVar3 = 0x1c;
    }
    cVar5 = '\x01';
    if (*(int *)(this + 8) != 0x74737552 || *(long *)this != 0x5f474e414c5f5744) {
      cVar5 = cVar4;
    }
  }
  cVar4 = cVar5;
  if ((pcVar7 == (char *)0xb) && (cVar5 == '\0')) {
    if (*(long *)(this + 3) == 0x3131435f474e414c && *(long *)this == 0x5f474e414c5f5744) {
      uVar3 = 0x1d;
    }
    cVar4 = '\x01';
    if (*(long *)(this + 3) != 0x3131435f474e414c || *(long *)this != 0x5f474e414c5f5744) {
      cVar4 = cVar5;
    }
  }
  cVar5 = cVar4;
  if ((pcVar7 == (char *)0xd) && (cVar4 == '\0')) {
    if (*(long *)(this + 5) == 0x74666977535f474e && *(long *)this == 0x5f474e414c5f5744) {
      uVar3 = 0x1e;
    }
    cVar5 = '\x01';
    if (*(long *)(this + 5) != 0x74666977535f474e || *(long *)this != 0x5f474e414c5f5744) {
      cVar5 = cVar4;
    }
  }
  cVar4 = cVar5;
  if ((pcVar7 == (char *)0xd) && (cVar5 == '\0')) {
    if (*(long *)(this + 5) == 0x61696c754a5f474e && *(long *)this == 0x5f474e414c5f5744) {
      uVar3 = 0x1f;
    }
    cVar4 = '\x01';
    if (*(long *)(this + 5) != 0x61696c754a5f474e || *(long *)this != 0x5f474e414c5f5744) {
      cVar4 = cVar5;
    }
  }
  cVar5 = cVar4;
  if ((pcVar7 == (char *)0xd) && (cVar4 == '\0')) {
    if (*(long *)(this + 5) == 0x6e616c79445f474e && *(long *)this == 0x5f474e414c5f5744) {
      uVar3 = 0x20;
    }
    cVar5 = '\x01';
    if (*(long *)(this + 5) != 0x6e616c79445f474e || *(long *)this != 0x5f474e414c5f5744) {
      cVar5 = cVar4;
    }
  }
  cVar4 = cVar5;
  if ((pcVar7 == (char *)0x16) && (cVar5 == '\0')) {
    auVar31[0] = -(*this == (dwarf)0x44);
    auVar31[1] = -(this[1] == (dwarf)0x57);
    auVar31[2] = -(this[2] == (dwarf)0x5f);
    auVar31[3] = -(this[3] == (dwarf)0x4c);
    auVar31[4] = -(this[4] == (dwarf)0x41);
    auVar31[5] = -(this[5] == (dwarf)0x4e);
    auVar31[6] = -(this[6] == (dwarf)0x47);
    auVar31[7] = -(this[7] == (dwarf)0x5f);
    auVar31[8] = -(this[8] == (dwarf)0x43);
    auVar31[9] = -(this[9] == (dwarf)0x5f);
    auVar31[10] = -(this[10] == (dwarf)0x70);
    auVar31[0xb] = -(this[0xb] == (dwarf)0x6c);
    auVar31[0xc] = -(this[0xc] == (dwarf)0x75);
    auVar31[0xd] = -(this[0xd] == (dwarf)0x73);
    auVar31[0xe] = -(this[0xe] == (dwarf)0x5f);
    auVar31[0xf] = -(this[0xf] == (dwarf)0x70);
    auVar17[0] = -(this[6] == (dwarf)'G');
    auVar17[1] = -(this[7] == (dwarf)'_');
    auVar17[2] = -(this[8] == (dwarf)'C');
    auVar17[3] = -(this[9] == (dwarf)'_');
    auVar17[4] = -(this[10] == (dwarf)'p');
    auVar17[5] = -(this[0xb] == (dwarf)'l');
    auVar17[6] = -(this[0xc] == (dwarf)'u');
    auVar17[7] = -(this[0xd] == (dwarf)'s');
    auVar17[8] = -(this[0xe] == (dwarf)'_');
    auVar17[9] = -(this[0xf] == (dwarf)'p');
    auVar17[10] = -(this[0x10] == (dwarf)'l');
    auVar17[0xb] = -(this[0x11] == (dwarf)'u');
    auVar17[0xc] = -(this[0x12] == (dwarf)'s');
    auVar17[0xd] = -(this[0x13] == (dwarf)'_');
    auVar17[0xe] = -(this[0x14] == (dwarf)'1');
    auVar17[0xf] = -(this[0x15] == (dwarf)'4');
    auVar17 = auVar17 & auVar31;
    bVar8 = (ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar8) {
      uVar3 = 0x21;
    }
    cVar4 = '\x01';
    if (!bVar8) {
      cVar4 = cVar5;
    }
  }
  cVar5 = cVar4;
  if ((pcVar7 == (char *)0x11) && (cVar4 == '\0')) {
    auVar32[0] = -(*this == (dwarf)0x44);
    auVar32[1] = -(this[1] == (dwarf)0x57);
    auVar32[2] = -(this[2] == (dwarf)0x5f);
    auVar32[3] = -(this[3] == (dwarf)0x4c);
    auVar32[4] = -(this[4] == (dwarf)0x41);
    auVar32[5] = -(this[5] == (dwarf)0x4e);
    auVar32[6] = -(this[6] == (dwarf)0x47);
    auVar32[7] = -(this[7] == (dwarf)0x5f);
    auVar32[8] = -(this[8] == (dwarf)0x46);
    auVar32[9] = -(this[9] == (dwarf)0x6f);
    auVar32[10] = -(this[10] == (dwarf)0x72);
    auVar32[0xb] = -(this[0xb] == (dwarf)0x74);
    auVar32[0xc] = -(this[0xc] == (dwarf)0x72);
    auVar32[0xd] = -(this[0xd] == (dwarf)0x61);
    auVar32[0xe] = -(this[0xe] == (dwarf)0x6e);
    auVar32[0xf] = -(this[0xf] == (dwarf)0x30);
    auVar18[0] = -(this[0x10] == (dwarf)'3');
    auVar18[1] = 0xff;
    auVar18[2] = 0xff;
    auVar18[3] = 0xff;
    auVar18[4] = 0xff;
    auVar18[5] = 0xff;
    auVar18[6] = 0xff;
    auVar18[7] = 0xff;
    auVar18[8] = 0xff;
    auVar18[9] = 0xff;
    auVar18[10] = 0xff;
    auVar18[0xb] = 0xff;
    auVar18[0xc] = 0xff;
    auVar18[0xd] = 0xff;
    auVar18[0xe] = 0xff;
    auVar18[0xf] = 0xff;
    auVar18 = auVar18 & auVar32;
    bVar8 = (ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar8) {
      uVar3 = 0x22;
    }
    cVar5 = '\x01';
    if (!bVar8) {
      cVar5 = cVar4;
    }
  }
  cVar4 = cVar5;
  if ((pcVar7 == (char *)0x11) && (cVar5 == '\0')) {
    auVar33[0] = -(*this == (dwarf)0x44);
    auVar33[1] = -(this[1] == (dwarf)0x57);
    auVar33[2] = -(this[2] == (dwarf)0x5f);
    auVar33[3] = -(this[3] == (dwarf)0x4c);
    auVar33[4] = -(this[4] == (dwarf)0x41);
    auVar33[5] = -(this[5] == (dwarf)0x4e);
    auVar33[6] = -(this[6] == (dwarf)0x47);
    auVar33[7] = -(this[7] == (dwarf)0x5f);
    auVar33[8] = -(this[8] == (dwarf)0x46);
    auVar33[9] = -(this[9] == (dwarf)0x6f);
    auVar33[10] = -(this[10] == (dwarf)0x72);
    auVar33[0xb] = -(this[0xb] == (dwarf)0x74);
    auVar33[0xc] = -(this[0xc] == (dwarf)0x72);
    auVar33[0xd] = -(this[0xd] == (dwarf)0x61);
    auVar33[0xe] = -(this[0xe] == (dwarf)0x6e);
    auVar33[0xf] = -(this[0xf] == (dwarf)0x30);
    auVar19[0] = -(this[0x10] == (dwarf)0x38);
    auVar19[1] = 0xff;
    auVar19[2] = 0xff;
    auVar19[3] = 0xff;
    auVar19[4] = 0xff;
    auVar19[5] = 0xff;
    auVar19[6] = 0xff;
    auVar19[7] = 0xff;
    auVar19[8] = 0xff;
    auVar19[9] = 0xff;
    auVar19[10] = 0xff;
    auVar19[0xb] = 0xff;
    auVar19[0xc] = 0xff;
    auVar19[0xd] = 0xff;
    auVar19[0xe] = 0xff;
    auVar19[0xf] = 0xff;
    auVar19 = auVar19 & auVar33;
    bVar8 = (ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar8) {
      uVar3 = 0x23;
    }
    cVar4 = '\x01';
    if (!bVar8) {
      cVar4 = cVar5;
    }
  }
  cVar5 = cVar4;
  if ((pcVar7 == (char *)0x14) && (cVar4 == '\0')) {
    uVar1 = *(undefined4 *)(this + 0x10);
    auVar34[0] = -((char)uVar1 == 'r');
    auVar34[1] = -((char)((uint)uVar1 >> 8) == 'i');
    auVar34[2] = -((char)((uint)uVar1 >> 0x10) == 'p');
    auVar34[3] = -((char)((uint)uVar1 >> 0x18) == 't');
    auVar34[4] = 0xff;
    auVar34[5] = 0xff;
    auVar34[6] = 0xff;
    auVar34[7] = 0xff;
    auVar34[8] = 0xff;
    auVar34[9] = 0xff;
    auVar34[10] = 0xff;
    auVar34[0xb] = 0xff;
    auVar34[0xc] = 0xff;
    auVar34[0xd] = 0xff;
    auVar34[0xe] = 0xff;
    auVar34[0xf] = 0xff;
    auVar20[0] = -(*this == (dwarf)'D');
    auVar20[1] = -(this[1] == (dwarf)'W');
    auVar20[2] = -(this[2] == (dwarf)'_');
    auVar20[3] = -(this[3] == (dwarf)'L');
    auVar20[4] = -(this[4] == (dwarf)'A');
    auVar20[5] = -(this[5] == (dwarf)'N');
    auVar20[6] = -(this[6] == (dwarf)'G');
    auVar20[7] = -(this[7] == (dwarf)'_');
    auVar20[8] = -(this[8] == (dwarf)'R');
    auVar20[9] = -(this[9] == (dwarf)'e');
    auVar20[10] = -(this[10] == (dwarf)'n');
    auVar20[0xb] = -(this[0xb] == (dwarf)'d');
    auVar20[0xc] = -(this[0xc] == (dwarf)'e');
    auVar20[0xd] = -(this[0xd] == (dwarf)'r');
    auVar20[0xe] = -(this[0xe] == (dwarf)'S');
    auVar20[0xf] = -(this[0xf] == (dwarf)'c');
    auVar20 = auVar20 & auVar34;
    bVar8 = (ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar8) {
      uVar3 = 0x24;
    }
    cVar5 = '\x01';
    if (!bVar8) {
      cVar5 = cVar4;
    }
  }
  cVar4 = cVar5;
  if ((pcVar7 == (char *)0xd) && (cVar5 == '\0')) {
    if (*(long *)(this + 5) == 0x5353494c425f474e && *(long *)this == 0x5f474e414c5f5744) {
      uVar3 = 0x25;
    }
    cVar4 = '\x01';
    if (*(long *)(this + 5) != 0x5353494c425f474e || *(long *)this != 0x5f474e414c5f5744) {
      cVar4 = cVar5;
    }
  }
  cVar5 = cVar4;
  if ((pcVar7 == (char *)0x16) && (cVar4 == '\0')) {
    auVar35[0] = -(this[6] == (dwarf)'G');
    auVar35[1] = -(this[7] == (dwarf)'_');
    auVar35[2] = -(this[8] == (dwarf)'M');
    auVar35[3] = -(this[9] == (dwarf)'i');
    auVar35[4] = -(this[10] == (dwarf)'p');
    auVar35[5] = -(this[0xb] == (dwarf)'s');
    auVar35[6] = -(this[0xc] == (dwarf)'_');
    auVar35[7] = -(this[0xd] == (dwarf)'A');
    auVar35[8] = -(this[0xe] == (dwarf)'s');
    auVar35[9] = -(this[0xf] == (dwarf)'s');
    auVar35[10] = -(this[0x10] == (dwarf)'e');
    auVar35[0xb] = -(this[0x11] == (dwarf)'m');
    auVar35[0xc] = -(this[0x12] == (dwarf)'b');
    auVar35[0xd] = -(this[0x13] == (dwarf)'l');
    auVar35[0xe] = -(this[0x14] == (dwarf)'e');
    auVar35[0xf] = -(this[0x15] == (dwarf)'r');
    auVar21[0] = -(*this == (dwarf)'D');
    auVar21[1] = -(this[1] == (dwarf)'W');
    auVar21[2] = -(this[2] == (dwarf)'_');
    auVar21[3] = -(this[3] == (dwarf)'L');
    auVar21[4] = -(this[4] == (dwarf)'A');
    auVar21[5] = -(this[5] == (dwarf)'N');
    auVar21[6] = -(this[6] == (dwarf)'G');
    auVar21[7] = -(this[7] == (dwarf)'_');
    auVar21[8] = -(this[8] == (dwarf)'M');
    auVar21[9] = -(this[9] == (dwarf)'i');
    auVar21[10] = -(this[10] == (dwarf)'p');
    auVar21[0xb] = -(this[0xb] == (dwarf)'s');
    auVar21[0xc] = -(this[0xc] == (dwarf)'_');
    auVar21[0xd] = -(this[0xd] == (dwarf)'A');
    auVar21[0xe] = -(this[0xe] == (dwarf)'s');
    auVar21[0xf] = -(this[0xf] == (dwarf)'s');
    auVar21 = auVar21 & auVar35;
    bVar8 = (ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar8) {
      uVar3 = 0x8001;
    }
    cVar5 = '\x01';
    if (!bVar8) {
      cVar5 = cVar4;
    }
  }
  cVar4 = cVar5;
  if ((pcVar7 == (char *)0x1b) && (cVar5 == '\0')) {
    auVar36[0] = -(this[0xb] == (dwarf)'G');
    auVar36[1] = -(this[0xc] == (dwarf)'L');
    auVar36[2] = -(this[0xd] == (dwarf)'E');
    auVar36[3] = -(this[0xe] == (dwarf)'_');
    auVar36[4] = -(this[0xf] == (dwarf)'R');
    auVar36[5] = -(this[0x10] == (dwarf)'e');
    auVar36[6] = -(this[0x11] == (dwarf)'n');
    auVar36[7] = -(this[0x12] == (dwarf)'d');
    auVar36[8] = -(this[0x13] == (dwarf)'e');
    auVar36[9] = -(this[0x14] == (dwarf)'r');
    auVar36[10] = -(this[0x15] == (dwarf)'S');
    auVar36[0xb] = -(this[0x16] == (dwarf)'c');
    auVar36[0xc] = -(this[0x17] == (dwarf)'r');
    auVar36[0xd] = -(this[0x18] == (dwarf)'i');
    auVar36[0xe] = -(this[0x19] == (dwarf)'p');
    auVar36[0xf] = -(this[0x1a] == (dwarf)'t');
    auVar22[0] = -(*this == (dwarf)'D');
    auVar22[1] = -(this[1] == (dwarf)'W');
    auVar22[2] = -(this[2] == (dwarf)'_');
    auVar22[3] = -(this[3] == (dwarf)'L');
    auVar22[4] = -(this[4] == (dwarf)'A');
    auVar22[5] = -(this[5] == (dwarf)'N');
    auVar22[6] = -(this[6] == (dwarf)'G');
    auVar22[7] = -(this[7] == (dwarf)'_');
    auVar22[8] = -(this[8] == (dwarf)'G');
    auVar22[9] = -(this[9] == (dwarf)'O');
    auVar22[10] = -(this[10] == (dwarf)'O');
    auVar22[0xb] = -(this[0xb] == (dwarf)'G');
    auVar22[0xc] = -(this[0xc] == (dwarf)'L');
    auVar22[0xd] = -(this[0xd] == (dwarf)'E');
    auVar22[0xe] = -(this[0xe] == (dwarf)'_');
    auVar22[0xf] = -(this[0xf] == (dwarf)'R');
    auVar22 = auVar22 & auVar36;
    bVar8 = (ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar8) {
      uVar3 = 0x8e57;
    }
    cVar4 = '\x01';
    if (!bVar8) {
      cVar4 = cVar5;
    }
  }
  cVar5 = cVar4;
  if ((pcVar7 == (char *)0x16) && (cVar4 == '\0')) {
    auVar37[0] = -(this[6] == (dwarf)'G');
    auVar37[1] = -(this[7] == (dwarf)'_');
    auVar37[2] = -(this[8] == (dwarf)'B');
    auVar37[3] = -(this[9] == (dwarf)'O');
    auVar37[4] = -(this[10] == (dwarf)'R');
    auVar37[5] = -(this[0xb] == (dwarf)'L');
    auVar37[6] = -(this[0xc] == (dwarf)'A');
    auVar37[7] = -(this[0xd] == (dwarf)'N');
    auVar37[8] = -(this[0xe] == (dwarf)'D');
    auVar37[9] = -(this[0xf] == (dwarf)'_');
    auVar37[10] = -(this[0x10] == (dwarf)'D');
    auVar37[0xb] = -(this[0x11] == (dwarf)'e');
    auVar37[0xc] = -(this[0x12] == (dwarf)'l');
    auVar37[0xd] = -(this[0x13] == (dwarf)'p');
    auVar37[0xe] = -(this[0x14] == (dwarf)'h');
    auVar37[0xf] = -(this[0x15] == (dwarf)'i');
    auVar23[0] = -(*this == (dwarf)'D');
    auVar23[1] = -(this[1] == (dwarf)'W');
    auVar23[2] = -(this[2] == (dwarf)'_');
    auVar23[3] = -(this[3] == (dwarf)'L');
    auVar23[4] = -(this[4] == (dwarf)'A');
    auVar23[5] = -(this[5] == (dwarf)'N');
    auVar23[6] = -(this[6] == (dwarf)'G');
    auVar23[7] = -(this[7] == (dwarf)'_');
    auVar23[8] = -(this[8] == (dwarf)'B');
    auVar23[9] = -(this[9] == (dwarf)'O');
    auVar23[10] = -(this[10] == (dwarf)'R');
    auVar23[0xb] = -(this[0xb] == (dwarf)'L');
    auVar23[0xc] = -(this[0xc] == (dwarf)'A');
    auVar23[0xd] = -(this[0xd] == (dwarf)'N');
    auVar23[0xe] = -(this[0xe] == (dwarf)'D');
    auVar23[0xf] = -(this[0xf] == (dwarf)'_');
    auVar23 = auVar23 & auVar37;
    bVar8 = (ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) == 0xffff;
    if (bVar8) {
      uVar3 = 0xb000;
    }
    cVar5 = '\x01';
    if (!bVar8) {
      cVar5 = cVar4;
    }
  }
  uVar2 = 0;
  if (cVar5 != '\0') {
    uVar2 = uVar3;
  }
  return uVar2;
}

Assistant:

unsigned llvm::dwarf::getLanguage(StringRef LanguageString) {
  return StringSwitch<unsigned>(LanguageString)
#define HANDLE_DW_LANG(ID, NAME, LOWER_BOUND, VERSION, VENDOR)                 \
  .Case("DW_LANG_" #NAME, DW_LANG_##NAME)
#include "llvm/BinaryFormat/Dwarf.def"
      .Default(0);
}